

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * __thiscall
re2::CEscape_abi_cxx11_(string *__return_storage_ptr__,re2 *this,StringPiece *src)

{
  ulong uVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  
  lVar3 = *(long *)(this + 8);
  uVar1 = lVar3 * 4 + 1;
  pvVar5 = operator_new__(uVar1);
  if (lVar3 < 1) {
    uVar7 = 0;
  }
  else {
    pbVar8 = *(byte **)this;
    pbVar9 = pbVar8 + lVar3;
    uVar7 = 0;
    do {
      uVar6 = 0xffffffffffffffff;
      if (uVar1 - uVar7 < 2) goto LAB_001b03ab;
      bVar2 = *pbVar8;
      if (bVar2 < 0x22) {
        if (bVar2 == 9) {
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x745c;
          goto LAB_001b0357;
        }
        if (bVar2 == 10) {
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x6e5c;
          goto LAB_001b0357;
        }
        if (bVar2 == 0xd) {
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x725c;
          goto LAB_001b0357;
        }
LAB_001b0334:
        if (0xa0 < (byte)(bVar2 + 0x81)) {
          *(byte *)((long)pvVar5 + uVar7) = bVar2;
          uVar7 = uVar7 + 1;
          goto LAB_001b035b;
        }
        if (4 < uVar1 - uVar7) {
          snprintf((char *)((long)pvVar5 + uVar7),5,"\\%03o");
          uVar7 = uVar7 + 4;
          goto LAB_001b035b;
        }
        bVar4 = false;
      }
      else {
        if (bVar2 == 0x22) {
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x225c;
        }
        else if (bVar2 == 0x27) {
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x275c;
        }
        else {
          if (bVar2 != 0x5c) goto LAB_001b0334;
          *(undefined2 *)((long)pvVar5 + uVar7) = 0x5c5c;
        }
LAB_001b0357:
        uVar7 = uVar7 + 2;
LAB_001b035b:
        bVar4 = true;
      }
      if (!bVar4) goto LAB_001b03ab;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 < pbVar9);
  }
  uVar6 = 0xffffffffffffffff;
  if (uVar7 != uVar1) {
    *(undefined1 *)((long)pvVar5 + uVar7) = 0;
    uVar6 = uVar7;
  }
LAB_001b03ab:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar5,(long)pvVar5 + uVar6);
  operator_delete__(pvVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(const StringPiece& src) {
  const size_t dest_len = src.size() * 4 + 1; // Maximum possible expansion
  char* dest = new char[dest_len];
  const size_t used = CEscapeString(src.data(), src.size(),
                                    dest, dest_len);
  std::string s = std::string(dest, used);
  delete[] dest;
  return s;
}